

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O0

void __thiscall
QScopedPointer<QFutureInterfaceBasePrivate::ProgressData,_QScopedPointerDeleter<QFutureInterfaceBasePrivate::ProgressData>_>
::reset(QScopedPointer<QFutureInterfaceBasePrivate::ProgressData,_QScopedPointerDeleter<QFutureInterfaceBasePrivate::ProgressData>_>
        *this,ProgressData *other)

{
  long lVar1;
  ProgressData *ctx;
  long in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  ProgressData *oldD;
  ProgressData **in_stack_ffffffffffffffc8;
  ProgressData **in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (*in_RDI != in_RSI) {
    ctx = std::
          exchange<QFutureInterfaceBasePrivate::ProgressData*,QFutureInterfaceBasePrivate::ProgressData*&>
                    (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    QScopedPointerDeleter<QFutureInterfaceBasePrivate::ProgressData>::cleanup((EVP_PKEY_CTX *)ctx);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void reset(T *other = nullptr) noexcept(noexcept(Cleanup::cleanup(std::declval<T *>())))
    {
        if (d == other)
            return;
        T *oldD = std::exchange(d, other);
        Cleanup::cleanup(oldD);
    }